

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O2

GCproto * lj_bcread_proto(LexState *ls)

{
  char **pp;
  long *plVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  lua_State *plVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  GCproto *pt;
  GCstr *pGVar16;
  void *pvVar17;
  GCtab *t;
  TValue *pTVar18;
  ulong uVar19;
  char *pcVar20;
  byte bVar21;
  uint uVar22;
  size_t __n;
  ulong uVar23;
  long lVar24;
  uint32_t hbits;
  short sVar25;
  GCSize size;
  anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *paVar26;
  byte bVar27;
  byte *pbVar28;
  int iVar29;
  uint uVar30;
  double *pdVar31;
  bool bVar32;
  TValue local_38;
  
  pp = &ls->p;
  pbVar28 = (byte *)ls->p;
  ls->p = (char *)(pbVar28 + 1);
  bVar27 = *pbVar28;
  ls->p = (char *)(pbVar28 + 2);
  bVar21 = pbVar28[1];
  ls->p = (char *)(pbVar28 + 3);
  bVar3 = pbVar28[2];
  ls->p = (char *)(pbVar28 + 4);
  bVar4 = pbVar28[3];
  uVar7 = lj_buf_ruleb128(pp);
  uVar8 = lj_buf_ruleb128(pp);
  uVar9 = lj_buf_ruleb128(pp);
  uVar22 = uVar9 + 1;
  uVar11 = 0;
  if ((ls->level & 2) == 0) {
    uVar10 = lj_buf_ruleb128(pp);
    uVar12 = 0;
    __n = 0;
    uVar11 = 0;
    if (uVar10 != 0) {
      uVar11 = lj_buf_ruleb128(pp);
      uVar12 = lj_buf_ruleb128(pp);
      __n = (size_t)uVar10;
    }
  }
  else {
    uVar12 = 0;
    __n = 0;
  }
  uVar30 = (uVar7 + uVar22) * 4 + 0x47 & 0xfffffff8;
  iVar29 = uVar30 + uVar8 * 8;
  uVar13 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + iVar29;
  size = (int)__n + uVar13;
  pt = (GCproto *)lj_mem_newgco(ls->L,size);
  pt->gct = '\a';
  pt->numparams = bVar21;
  pt->framesize = bVar3;
  pt->sizebc = uVar22;
  lVar24 = (long)&(pt->nextgc).gcptr32 + (ulong)uVar30;
  (pt->k).ptr32 = (uint32_t)lVar24;
  (pt->uv).ptr32 = iVar29 + (int)pt;
  pt->sizekgc = 0;
  pt->sizekn = uVar8;
  pt->sizept = size;
  pt->sizeuv = bVar4;
  pt->flags = bVar27;
  pt->trace = 0;
  (pt->chunkname).gcptr32 = *(uint32_t *)&ls->chunkname;
  *(undefined4 *)(lVar24 + (ulong)(uVar7 + 1) * -4) = 0;
  bVar27 = (bVar27 & 2) >> 1;
  pt[1].nextgc.gcptr32 = (uint)bVar27 + (uint)bVar27 * 2 + (uint)bVar3 * 0x100 + 0x59;
  uVar19 = (ulong)(uVar22 * 4 - 4);
  pcVar20 = ls->p;
  ls->p = pcVar20 + uVar19;
  memcpy(&pt[1].marked,pcVar20,uVar19);
  if ((ls->level & 1) != 0) {
    for (lVar24 = 0x11; lVar24 - 0x10U < (ulong)uVar22; lVar24 = lVar24 + 1) {
      uVar30 = (&pt->nextgc)[lVar24].gcptr32;
      (&pt->nextgc)[lVar24].gcptr32 =
           uVar30 >> 0x18 | (uVar30 & 0xff0000) >> 8 | (uVar30 & 0xff00) << 8 | uVar30 << 0x18;
    }
  }
  if (bVar4 != 0) {
    pvVar17 = (void *)(ulong)(pt->uv).ptr32;
    pcVar20 = ls->p;
    ls->p = pcVar20 + ((uint)bVar4 + (uint)bVar4);
    memcpy(pvVar17,pcVar20,(ulong)((uint)bVar4 + (uint)bVar4));
    if ((ls->level & 1) != 0) {
      for (uVar19 = 0; bVar4 != uVar19; uVar19 = uVar19 + 1) {
        puVar2 = (ushort *)((long)pvVar17 + uVar19 * 2);
        *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
      }
    }
  }
  paVar26 = (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0 *)
            ((ulong)(pt->k).ptr32 + (ulong)uVar7 * -4);
  uVar10 = 0;
  do {
    if (uVar10 == uVar7) {
      pt->sizekgc = uVar7;
      pdVar31 = (double *)(ulong)(pt->k).ptr32;
      for (uVar7 = 0; uVar7 != uVar8; uVar7 = uVar7 + 1) {
        bVar27 = **pp;
        pbVar28 = (byte *)(*pp + 1);
        uVar22 = (uint)(bVar27 >> 1);
        if ((char)bVar27 < '\0') {
          uVar22 = uVar22 & 0x3f;
          bVar21 = 6;
          do {
            bVar3 = *pbVar28;
            uVar22 = uVar22 | (bVar3 & 0x7f) << (bVar21 & 0x1f);
            pbVar28 = pbVar28 + 1;
            bVar21 = bVar21 + 7;
          } while ((char)bVar3 < '\0');
        }
        *pp = (char *)pbVar28;
        if ((bVar27 & 1) == 0) {
          *pdVar31 = (double)(int)uVar22;
        }
        else {
          *(uint *)pdVar31 = uVar22;
          uVar10 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pdVar31 + 4) = uVar10;
        }
        pdVar31 = pdVar31 + 1;
      }
      pt->firstline = uVar11;
      pt->numline = uVar12;
      if ((int)__n == 0) {
        pt->lineinfo = 0;
        pt->uvinfo = 0;
        uVar22 = 0;
      }
      else {
        bVar27 = 2 - ((int)uVar12 < 0x10000);
        if ((int)uVar12 < 0x100) {
          bVar27 = 0;
        }
        uVar19 = (long)&(pt->nextgc).gcptr32 + (ulong)uVar13;
        uVar11 = (uint32_t)uVar19;
        (pt->lineinfo).ptr32 = uVar11;
        (pt->uvinfo).ptr32 = (uVar9 << (bVar27 & 0x1f)) + uVar11;
        pvVar17 = (void *)(uVar19 & 0xffffffff);
        pcVar20 = ls->p;
        ls->p = pcVar20 + __n;
        memcpy(pvVar17,pcVar20,__n);
        if (((ls->level & 1) != 0) && (0xff < pt->numline)) {
          uVar19 = (ulong)(pt->sizebc - 1);
          if ((uint)pt->numline < 0x10000) {
            for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
              puVar2 = (ushort *)((long)pvVar17 + uVar23 * 2);
              *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            }
          }
          else {
            for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
              uVar22 = *(uint *)((long)pvVar17 + uVar23 * 4);
              *(uint *)((long)pvVar17 + uVar23 * 4) =
                   uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                   uVar22 << 0x18;
            }
          }
        }
        uVar22 = (pt->uvinfo).ptr32;
        pcVar20 = (char *)(ulong)uVar22;
        uVar13 = (uint)pt->sizeuv;
        if (pt->sizeuv != 0) {
          do {
            uVar19 = (ulong)pcVar20 & 0xffffffff;
            do {
              uVar22 = (int)uVar19 + 1;
              uVar19 = (ulong)uVar22;
              cVar5 = *pcVar20;
              pcVar20 = pcVar20 + 1;
            } while (cVar5 != '\0');
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
      }
      (pt->varinfo).ptr32 = uVar22;
      lj_memprof_add_proto(pt);
      lj_sysprof_add_proto(pt);
      return pt;
    }
    uVar14 = lj_buf_ruleb128(pp);
    if (uVar14 < 5) {
      if (uVar14 == 0) {
        plVar6 = ls->L;
        pTVar18 = plVar6->top;
        if (pTVar18 <= (TValue *)((long)ls->lastline + (ulong)(plVar6->stack).ptr32)) {
          bcread_error(ls,LJ_ERR_BCBAD);
        }
        plVar6->top = pTVar18 + -1;
        *paVar26 = pTVar18[-1].field_2.field_0;
      }
      else if (uVar14 == 1) {
        uVar14 = lj_buf_ruleb128(pp);
        uVar15 = lj_buf_ruleb128(pp);
        if (uVar15 == 0) {
          hbits = 0;
        }
        else {
          hbits = 1;
          if (uVar15 != 1) {
            uVar22 = 0x1f;
            if (uVar15 - 1 != 0) {
              for (; uVar15 - 1 >> uVar22 == 0; uVar22 = uVar22 - 1) {
              }
            }
            hbits = (uVar22 ^ 0xffffffe0) + 0x21;
          }
        }
        t = lj_tab_new(ls->L,uVar14,hbits);
        if (uVar14 != 0) {
          pTVar18 = (TValue *)(ulong)(t->array).ptr32;
          while (bVar32 = uVar14 != 0, uVar14 = uVar14 - 1, bVar32) {
            bcread_ktabk(ls,pTVar18);
            pTVar18 = pTVar18 + 1;
          }
        }
        if (uVar15 != 0) {
          while (bVar32 = uVar15 != 0, uVar15 = uVar15 - 1, bVar32) {
            bcread_ktabk(ls,&local_38);
            pTVar18 = lj_tab_set(ls->L,t,&local_38);
            bcread_ktabk(ls,pTVar18);
          }
        }
        paVar26->i = (int32_t)t;
      }
      else {
        sVar25 = (uVar14 != 2) + 0xb;
        plVar6 = ls->L;
        if (uVar14 == 4) {
          sVar25 = 0x10;
        }
        pvVar17 = lj_mem_newgco(plVar6,(uint)(uVar14 == 4) * 8 + 0x10);
        *(undefined1 *)((long)pvVar17 + 5) = 10;
        *(short *)((long)pvVar17 + 6) = sVar25;
        plVar1 = (long *)((ulong)(plVar6->glref).ptr32 + 0xe0);
        *plVar1 = *plVar1 + 1;
        paVar26->i = (int32_t)pvVar17;
        uVar15 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pvVar17 + 8) = uVar15;
        uVar15 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pvVar17 + 0xc) = uVar15;
        if (uVar14 == 4) {
          uVar14 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar17 + 0x10) = uVar14;
          uVar14 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar17 + 0x14) = uVar14;
        }
      }
    }
    else {
      pcVar20 = ls->p;
      ls->p = pcVar20 + (uVar14 - 5);
      pGVar16 = lj_str_new(ls->L,pcVar20,(ulong)(uVar14 - 5));
      paVar26->i = (int32_t)pGVar16;
    }
    uVar10 = uVar10 + 1;
    paVar26 = paVar26 + 1;
  } while( true );
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif

#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  return pt;
}